

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O0

void dump_regmat_statistics
               (float64 *****regl,float64 ****regr,uint32 nclass,uint32 nfeat,uint32 *veclen)

{
  uint uVar1;
  uint local_3c;
  uint32 len;
  uint32 m;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_local;
  uint32 nfeat_local;
  uint32 nclass_local;
  float64 ****regr_local;
  float64 *****regl_local;
  
  printf("regl\n");
  for (local_3c = 0; local_3c < nclass; local_3c = local_3c + 1) {
    for (k = 0; k < nfeat; k = k + 1) {
      uVar1 = veclen[k];
      for (len = 0; len < uVar1; len = len + 1) {
        printf("class: %d, stream: %d, mixture %d\n",(ulong)local_3c,(ulong)k,(ulong)len);
        for (l = 0; l < uVar1; l = l + 1) {
          printf("%d ",(ulong)l);
          for (m = 0; m < uVar1; m = m + 1) {
            printf("%f ",regl[local_3c][k][len][l][m]);
          }
          printf("\n");
        }
      }
    }
  }
  printf("regr\n");
  for (local_3c = 0; local_3c < nclass; local_3c = local_3c + 1) {
    for (k = 0; k < nfeat; k = k + 1) {
      uVar1 = veclen[k];
      for (len = 0; len < uVar1; len = len + 1) {
        printf("class: %d, stream: %d, mixture %d\n",(ulong)local_3c,(ulong)k,(ulong)len);
        for (l = 0; l < uVar1; l = l + 1) {
          printf("%f ",regr[local_3c][k][len][l]);
        }
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void dump_regmat_statistics(float64 *****regl,
		       float64 ****regr,
		       uint32 nclass,
		       uint32 nfeat,
		       const uint32  *veclen)

{
  uint32  i,j,k,l,m,len;

  printf("regl\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%d ", j);
	  for(k=0;k<len;k++){
	    printf("%f ",regl[m][i][l][j][k]);
	  }
	    printf("\n");
	}
	}
    }
  }
  
  printf("regr\n");
  for(m=0; m <nclass ; m++){
    for(i=0; i < nfeat ;i++){
      len=veclen[i];
      for(l=0; l < len ; l++){
	printf("class: %d, stream: %d, mixture %d\n",m,i,l);
	for(j=0;j<len;j++){
	  printf("%f ",regr[m][i][l][j]);
	}
	printf("\n");
      }
    }
  }
    
}